

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

int xmlNanoFTPSendUser(void *ctx)

{
  size_t sVar1;
  ssize_t sVar2;
  int res;
  int len;
  char buf [200];
  xmlNanoFTPCtxtPtr ctxt;
  void *ctx_local;
  
  buf._192_8_ = ctx;
  if (*(long *)((long)ctx + 0x20) == 0) {
    snprintf((char *)&res,200,"USER anonymous\r\n");
  }
  else {
    snprintf((char *)&res,200,"USER %s\r\n");
  }
  buf[0xbf] = '\0';
  sVar1 = strlen((char *)&res);
  sVar2 = send(*(int *)(buf._192_8_ + 0x44),&res,(long)(int)sVar1,0);
  ctx_local._4_4_ = (int)sVar2;
  if (ctx_local._4_4_ < 0) {
    __xmlIOErr(9,0,"send failed");
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
xmlNanoFTPSendUser(void *ctx) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[200];
    int len;
    int res;

    if (ctxt->user == NULL)
	snprintf(buf, sizeof(buf), "USER anonymous\r\n");
    else
	snprintf(buf, sizeof(buf), "USER %s\r\n", ctxt->user);
    buf[sizeof(buf) - 1] = 0;
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	return(res);
    }
    return(0);
}